

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O0

char * cinatra::detail::parse_http_version(char *buf,char *buf_end,int *minor_version,int *ret)

{
  char *pcVar1;
  int *ret_local;
  int *minor_version_local;
  char *buf_end_local;
  char *buf_local;
  char *local_8;
  
  if ((long)buf_end - (long)buf < 9) {
    *ret = -2;
    local_8 = (char *)0x0;
  }
  else if (*buf == 'H') {
    if (buf[1] == 'T') {
      if (buf[2] == 'T') {
        if (buf[3] == 'P') {
          if (buf[4] == '/') {
            if (buf[5] == '1') {
              pcVar1 = buf + 7;
              if (buf[6] == '.') {
                if ((*pcVar1 < '0') || ('9' < *pcVar1)) {
                  *ret = -1;
                  local_8 = (char *)0x0;
                }
                else {
                  local_8 = buf + 8;
                  *minor_version = *pcVar1 + -0x30;
                }
              }
              else {
                *ret = -1;
                local_8 = (char *)0x0;
              }
            }
            else {
              *ret = -1;
              local_8 = (char *)0x0;
            }
          }
          else {
            *ret = -1;
            local_8 = (char *)0x0;
          }
        }
        else {
          *ret = -1;
          local_8 = (char *)0x0;
        }
      }
      else {
        *ret = -1;
        local_8 = (char *)0x0;
      }
    }
    else {
      *ret = -1;
      local_8 = (char *)0x0;
    }
  }
  else {
    *ret = -1;
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char *parse_http_version(const char *buf, const char *buf_end,
                                      int *minor_version, int *ret) {
  /* we want at least [HTTP/1.<two chars>] to try to parse */
  if (buf_end - buf < 9) {
    *ret = -2;
    return NULL;
  }
  EXPECT_CHAR_NO_CHECK('H');
  EXPECT_CHAR_NO_CHECK('T');
  EXPECT_CHAR_NO_CHECK('T');
  EXPECT_CHAR_NO_CHECK('P');
  EXPECT_CHAR_NO_CHECK('/');
  EXPECT_CHAR_NO_CHECK('1');
  EXPECT_CHAR_NO_CHECK('.');
  PARSE_INT(minor_version, 1);
  return buf;
}